

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

uint64_t __thiscall r_comp::Decompiler::decompile_references(Decompiler *this,Image *image)

{
  Metadata *this_00;
  mapped_type mVar1;
  bool bVar2;
  ushort uVar3;
  mapped_type mVar4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
  *this_01;
  ulong uVar5;
  size_t sVar6;
  SysObject **ppSVar7;
  pointer ppVar8;
  mapped_type *pmVar9;
  mapped_type *this_02;
  mapped_type *pmVar10;
  pair<std::__detail::_Node_iterator<unsigned_short,_true,_false>,_bool> pVar11;
  __cxx11 local_108 [32];
  _Node_iterator_base<unsigned_short,_false> local_e8;
  undefined1 local_e0;
  value_type local_d2;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_d0;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_c8;
  iterator iterator;
  SysObject *sys_object;
  uint16_t i;
  Class *pCStack_b0;
  uint16_t last_object_ID;
  Class *c;
  string name;
  key_type local_78;
  reference local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>
  *c_1;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
  *__range1;
  unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
  object_ID_per_class;
  Image *image_local;
  Decompiler *this_local;
  
  object_ID_per_class._M_h._M_single_bucket = (__node_base_ptr)image;
  std::
  unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
  ::unordered_map((unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
                   *)&__range1);
  this_01 = &this->metadata->sys_classes;
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
           ::begin(this_01);
  c_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>
         *)std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>_>
           ::end(this_01);
  while( true ) {
    bVar2 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_true>
                         *)&c_1);
    if (!bVar2) break;
    local_70 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
               ::operator*(&__end1);
    local_78 = &local_70->second;
    pmVar9 = std::
             unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
             ::operator[]((unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
                           *)&__range1,&local_78);
    *pmVar9 = 0;
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_false,_true>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)&c);
  this->image = (Image *)object_ID_per_class._M_h._M_single_bucket;
  sys_object._4_2_ = 0;
  while( true ) {
    uVar5 = (ulong)sys_object._4_2_;
    sVar6 = r_code::vector<r_code::SysObject_*>::size
                      ((vector<r_code::SysObject_*> *)
                       (object_ID_per_class._M_h._M_single_bucket + 0xb));
    if (sVar6 <= uVar5) break;
    ppSVar7 = r_code::vector<r_code::SysObject_*>::operator[]
                        ((vector<r_code::SysObject_*> *)
                         (object_ID_per_class._M_h._M_single_bucket + 0xb),(ulong)sys_object._4_2_);
    iterator.
    super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_cur = (_Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               )*ppSVar7;
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(object_ID_per_class._M_h._M_single_bucket + 0xe),
                (key_type *)
                &((__node_type *)
                 ((long)iterator.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        ._M_cur + 0x60))->
                 super__Hash_node_value<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
               );
    local_d0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(object_ID_per_class._M_h._M_single_bucket + 0xe));
    bVar2 = std::__detail::operator!=(&local_c8,&local_d0);
    if (bVar2) {
      ppVar8 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                             *)&local_c8);
      std::__cxx11::string::operator=((string *)&c,(string *)&ppVar8->second);
      local_d2 = *(value_type *)
                  ((long)iterator.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                         ._M_cur + 0x68);
      pVar11 = std::
               unordered_set<unsigned_short,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<unsigned_short>_>
               ::insert(&this->named_objects,&local_d2);
      local_e8._M_cur =
           (__node_type *)pVar11.first.super__Node_iterator_base<unsigned_short,_false>._M_cur;
      local_e0 = pVar11.second;
    }
    else {
      this_00 = this->metadata;
      r_code::vector<r_code::Atom>::operator[]
                ((vector<r_code::Atom> *)
                 ((long)iterator.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                        ._M_cur + 8),0);
      uVar3 = r_code::Atom::asOpcode();
      pCStack_b0 = Metadata::get_class(this_00,(ulong)uVar3);
      pmVar9 = std::
               unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
               ::operator[]((unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
                             *)&__range1,&stack0xffffffffffffff50);
      sys_object._6_2_ = *pmVar9;
      mVar4 = sys_object._6_2_ + 1;
      pmVar9 = std::
               unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
               ::operator[]((unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
                             *)&__range1,&stack0xffffffffffffff50);
      *pmVar9 = mVar4;
      std::__cxx11::string::operator=((string *)&c,(string *)&pCStack_b0->str_opcode);
      std::__cxx11::to_string(local_108,(uint)sys_object._6_2_);
      std::__cxx11::string::operator+=((string *)&c,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
    }
    this_02 = std::
              unordered_map<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->object_names,(key_type *)((long)&sys_object + 4));
    std::__cxx11::string::operator=((string *)this_02,(string *)&c);
    mVar1 = sys_object._4_2_;
    pmVar10 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>_>
              ::operator[](&this->object_indices,(key_type *)&c);
    *pmVar10 = mVar1;
    sys_object._4_2_ = sys_object._4_2_ + 1;
  }
  this->closing_set = false;
  sVar6 = r_code::vector<r_code::SysObject_*>::size
                    ((vector<r_code::SysObject_*> *)
                     (object_ID_per_class._M_h._M_single_bucket + 0xb));
  std::__cxx11::string::~string((string *)&c);
  std::
  unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
  ::~unordered_map((unordered_map<const_r_comp::Class_*,_unsigned_short,_std::hash<const_r_comp::Class_*>,_std::equal_to<const_r_comp::Class_*>,_std::allocator<std::pair<const_r_comp::Class_*const,_unsigned_short>_>_>
                    *)&__range1);
  return sVar6;
}

Assistant:

uint64_t Decompiler::decompile_references(r_comp::Image *image)
{
    std::unordered_map<const Class *, uint16_t> object_ID_per_class;

    for (const std::pair<const std::string, Class> &c : metadata->sys_classes) {
        object_ID_per_class[&c.second] = 0;
    }

    std::string name;
    this->image = image;
    // populate object names first so they can be referenced in any order.
    Class *c;
    uint16_t last_object_ID;

    for (uint16_t i = 0; i < image->code_segment.objects.size(); ++i) {
        SysObject *sys_object = (SysObject *)image->code_segment.objects[i];
        const auto iterator = image->object_names.symbols.find(sys_object->oid);

        if (iterator != image->object_names.symbols.end()) {
            name = iterator->second;
            named_objects.insert(sys_object->oid);
        } else {
            c = metadata->get_class(sys_object->code[0].asOpcode());
            last_object_ID = object_ID_per_class[c];
            object_ID_per_class[c] = last_object_ID + 1;
            name = c->str_opcode;
            name += std::to_string(last_object_ID);
        }

        object_names[i] = name;
        object_indices[name] = i;
    }

    closing_set = false;
    return image->code_segment.objects.size();
}